

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 FormatMount(sxi32 nType,void *pConsumer,ProcConsumer xUserCons,void *pUserData,sxu32 *pOutLen,
                 char *zFormat,__va_list_tag *ap)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  sxi32 sVar9;
  uint uVar10;
  ProcConsumer *pp_Var11;
  undefined8 *puVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint *puVar18;
  double *pdVar19;
  ulong *puVar20;
  int nspace;
  uint uVar21;
  long lVar22;
  byte *pbVar23;
  int iVar24;
  int *piVar25;
  uint uVar26;
  byte *pbVar27;
  char cVar28;
  byte bVar29;
  uint uVar30;
  byte *pbVar31;
  ulong uVar32;
  char *__s;
  bool bVar33;
  bool bVar34;
  longdouble lVar35;
  longdouble lVar36;
  sxu32 local_490;
  sxi32 local_48c;
  sxi32 local_488;
  ProcConsumer local_480;
  ProcConsumer local_478;
  sxu32 *local_470;
  byte *local_468;
  ulong local_460;
  double local_458;
  double local_450;
  longdouble local_444;
  byte abStack_439 [1023];
  byte local_3a [10];
  
  local_488 = 0;
  local_490 = 0;
  if (pOutLen != (sxu32 *)0x0) {
    *pOutLen = 0;
  }
  if (nType == 6) {
    pp_Var11 = &local_480;
    pUserData = pConsumer;
  }
  else {
    if (nType != 1) {
      return -0xd;
    }
    pp_Var11 = &local_478;
    local_480 = xUserCons;
  }
  *pp_Var11 = (ProcConsumer)pUserData;
  local_460 = (ulong)abStack_439 & 0xffffffff;
  uVar14 = 0;
  __s = (char *)0x0;
  local_48c = nType;
  local_470 = pOutLen;
LAB_00110759:
  pbVar23 = (byte *)zFormat;
  if (*zFormat != 0x25) {
    if (*zFormat == 0) goto LAB_00111621;
    for (lVar22 = 1; (bVar29 = ((byte *)zFormat)[lVar22], bVar29 != 0 && (bVar29 != 0x25));
        lVar22 = lVar22 + 1) {
    }
    sVar9 = FormatConsumer(zFormat,(uint)lVar22,&local_490);
    if ((bVar29 == 0) || (sVar9 != 0)) goto LAB_00111621;
    pbVar23 = (byte *)zFormat + lVar22;
    __s = zFormat;
  }
  bVar29 = pbVar23[1];
  if (bVar29 != 0) {
    bVar6 = false;
    bVar33 = false;
    bVar5 = false;
    bVar7 = false;
    bVar8 = false;
    pbVar23 = pbVar23 + 2;
LAB_001107ce:
    pbVar31 = pbVar23;
    switch(bVar29) {
    case 0x2a:
      uVar30 = ap->gp_offset;
      if ((ulong)uVar30 < 0x29) {
        puVar18 = (uint *)((ulong)uVar30 + (long)ap->reg_save_area);
        ap->gp_offset = uVar30 + 8;
      }
      else {
        puVar18 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar18 + 2;
      }
      uVar26 = *puVar18;
      uVar30 = -uVar26;
      if (0 < (int)uVar26) {
        uVar30 = uVar26;
      }
      if ((int)uVar26 < 0) {
        bVar6 = true;
      }
      iVar16 = (int)(char)*pbVar31;
LAB_001108c1:
      uVar21 = 0x3f6;
      if ((int)uVar30 < 0x3f6) {
        uVar21 = uVar30;
      }
      uVar26 = 0xffffffff;
      if (iVar16 == 0x2e) {
        pbVar23 = pbVar31 + 1;
        iVar16 = (int)(char)*pbVar23;
        if (iVar16 == 0x2a) {
          uVar26 = ap->gp_offset;
          if ((ulong)uVar26 < 0x29) {
            puVar18 = (uint *)((ulong)uVar26 + (long)ap->reg_save_area);
            ap->gp_offset = uVar26 + 8;
          }
          else {
            puVar18 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar18 + 2;
          }
          uVar17 = *puVar18;
          uVar26 = -uVar17;
          if (0 < (int)uVar17) {
            uVar26 = uVar17;
          }
          iVar16 = (int)(char)pbVar31[2];
          pbVar31 = pbVar31 + 2;
        }
        else {
          pbVar31 = pbVar31 + 1;
          uVar26 = 0;
          if ((byte)(*pbVar23 - 0x30) < 10) {
            uVar26 = 0;
            do {
              uVar26 = (iVar16 + uVar26 * 10) - 0x30;
              pbVar23 = pbVar31 + 1;
              iVar16 = (int)(char)*pbVar23;
              pbVar31 = pbVar31 + 1;
            } while ((byte)(*pbVar23 - 0x30) < 10);
          }
        }
      }
      if ((iVar16 == 0x71) || (cVar28 = '\0', iVar16 == 0x6c)) {
        bVar34 = iVar16 == 0x71;
        iVar16 = (int)(char)pbVar31[1];
        pbVar31 = pbVar31 + 1;
        cVar28 = (iVar16 == 0x6c || bVar34) + '\x01';
      }
      goto LAB_00110980;
    case 0x2b:
      bVar33 = true;
      break;
    case 0x2c:
    case 0x2e:
    case 0x2f:
switchD_001107e1_caseD_2c:
      iVar16 = (int)(char)bVar29;
      pbVar31 = pbVar31 + -1;
      uVar30 = 0;
      if (iVar16 - 0x30U < 10) {
        uVar30 = 0;
        do {
          uVar30 = (iVar16 + uVar30 * 10) - 0x30;
          iVar16 = (int)(char)pbVar31[1];
          pbVar31 = pbVar31 + 1;
        } while (iVar16 - 0x30U < 10);
      }
      goto LAB_001108c1;
    case 0x2d:
      bVar6 = true;
      break;
    case 0x30:
      bVar8 = true;
      break;
    default:
      if (bVar29 == 0x20) {
        bVar5 = true;
      }
      else {
        if (bVar29 != 0x23) goto switchD_001107e1_caseD_2c;
        bVar7 = true;
      }
    }
    bVar29 = *pbVar31;
    pbVar23 = pbVar31 + 1;
    if (bVar29 == 0) goto code_r0x0011080c;
    goto LAB_001107ce;
  }
  FormatConsumer("%",1,&local_490);
LAB_00111621:
  if (local_470 != (sxu32 *)0x0) {
    *local_470 = local_490;
  }
  return local_488;
code_r0x0011080c:
  uVar30 = 0;
  uVar26 = 0xffffffff;
  uVar21 = 0;
  cVar28 = '\0';
  iVar16 = 0;
LAB_00110980:
  lVar22 = 0;
LAB_00110982:
  if (iVar16 != (char)(&InternFormat_aFmt)[lVar22]) goto code_r0x0011098f;
  cVar1 = (&DAT_00156288)[lVar22];
  switch(cVar1) {
  case '\x01':
    if (cVar28 == '\0') {
      uVar14 = ap->gp_offset;
      if (((&DAT_00156284)[lVar22] & 1) == 0) {
        if (uVar14 < 0x29) {
          puVar18 = (uint *)((ulong)uVar14 + (long)ap->reg_save_area);
          ap->gp_offset = uVar14 + 8;
        }
        else {
          puVar18 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar18 + 2;
        }
        uVar32 = (ulong)*puVar18;
      }
      else {
        if (uVar14 < 0x29) {
          piVar25 = (int *)((ulong)uVar14 + (long)ap->reg_save_area);
          ap->gp_offset = uVar14 + 8;
        }
        else {
          piVar25 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar25 + 2;
        }
        uVar32 = (ulong)*piVar25;
      }
    }
    else {
      uVar14 = ap->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar20 = (ulong *)((ulong)uVar14 + (long)ap->reg_save_area);
        ap->gp_offset = uVar14 + 8;
      }
      else {
        puVar20 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar20 + 1;
      }
      uVar32 = *puVar20;
    }
    if (0x3d7 < (int)uVar26) {
      uVar26 = 0x3d8;
    }
    if (((&DAT_00156284)[lVar22] & 1) == 0) {
      uVar13 = -uVar32;
      if (0 < (long)uVar32) {
        uVar13 = uVar32;
      }
      bVar33 = true;
      iVar16 = 0;
      bVar29 = 0;
    }
    else if ((long)uVar32 < 0) {
      uVar13 = -uVar32;
      bVar29 = 0x2d;
      iVar16 = -1;
      bVar33 = false;
    }
    else {
      if (!bVar33) {
        iVar16 = -(uint)bVar5;
        bVar29 = bVar5 << 5;
      }
      else {
        bVar29 = 0x2b;
        iVar16 = -1;
      }
      bVar33 = !bVar33 && !bVar5;
      uVar13 = uVar32;
    }
    lVar3 = *(long *)((long)&PTR_anon_var_dwarf_318b_00156290 + lVar22);
    bVar2 = (&DAT_00156281)[lVar22];
    iVar24 = -1;
    pbVar23 = local_3a;
    do {
      __s = (char *)pbVar23;
      uVar15 = (long)uVar13 / (long)(ulong)bVar2;
      *__s = *(byte *)(lVar3 + (long)uVar13 % (long)(ulong)bVar2);
      iVar24 = iVar24 + -1;
      uVar13 = uVar15;
      pbVar23 = (byte *)__s + -1;
    } while (0 < (long)uVar15);
    uVar14 = iVar16 + uVar21;
    if ((int)(iVar16 + uVar21) < (int)uVar26) {
      uVar14 = uVar26;
    }
    if (!bVar8) {
      uVar14 = uVar26;
    }
    if (0 < (int)(uVar14 + iVar24 + 1)) {
      __s = (char *)((byte *)__s + -1 + -(ulong)(uVar14 + iVar24));
      memset(__s,0x30,(ulong)(uVar14 + iVar24) + 1);
    }
    if (!bVar33) {
      ((byte *)__s)[-1] = bVar29;
      __s = (char *)((byte *)__s + -1);
    }
    if (((bVar7 && uVar32 != 0) &&
        (pbVar23 = *(byte **)((long)&DAT_00156298 + lVar22), pbVar23 != (byte *)0x0)) &&
       (bVar29 = *pbVar23, *__s != bVar29)) {
      while (bVar29 != 0) {
        pbVar23 = pbVar23 + 1;
        ((byte *)__s)[-1] = bVar29;
        __s = (char *)((byte *)__s + -1);
        bVar29 = *pbVar23;
      }
    }
    uVar14 = ((int)local_3a + 1) - (int)__s;
    goto LAB_001109c0;
  case '\x02':
  case '\x03':
  case '\x04':
    goto switchD_00110abe_caseD_2;
  case '\x05':
    uVar14 = ap->gp_offset;
    if ((ulong)uVar14 < 0x29) {
      puVar12 = (undefined8 *)((ulong)uVar14 + (long)ap->reg_save_area);
      ap->gp_offset = uVar14 + 8;
    }
    else {
      puVar12 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar12 + 1;
    }
    *(sxu32 *)*puVar12 = local_490;
    uVar21 = 0;
    uVar14 = 0;
    goto LAB_001109c0;
  case '\x06':
    uVar14 = ap->gp_offset;
    if ((ulong)uVar14 < 0x29) {
      puVar12 = (undefined8 *)((ulong)uVar14 + (long)ap->reg_save_area);
      ap->gp_offset = uVar14 + 8;
    }
    else {
      puVar12 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar12 + 1;
    }
    __s = (char *)*puVar12;
    if ((byte *)__s == (byte *)0x0) goto LAB_00111137;
    uVar30 = uVar26;
    if (-1 < (int)uVar26) goto LAB_001115f7;
    pbVar23 = (byte *)__s;
    if (*__s == 0) goto LAB_001115f4;
    pbVar27 = (byte *)__s + 2;
    goto LAB_00110e06;
  case '\a':
    abStack_439[1] = 0x25;
    goto LAB_001109ab;
  case '\b':
    uVar14 = ap->gp_offset;
    if ((ulong)uVar14 < 0x29) {
      pbVar23 = (byte *)((ulong)uVar14 + (long)ap->reg_save_area);
      ap->gp_offset = uVar14 + 8;
    }
    else {
      pbVar23 = (byte *)ap->overflow_arg_area;
      ap->overflow_arg_area = pbVar23 + 8;
    }
    abStack_439[1] = *pbVar23;
    uVar14 = 0x3d8;
    if ((int)uVar26 < 0x3d8) {
      uVar14 = uVar26;
    }
    if ((int)uVar26 < 0) {
      uVar14 = 1;
    }
    else if (1 < uVar26) {
      memset(abStack_439 + 2,(uint)*pbVar23,(ulong)(uVar14 - 2) + 1);
    }
    goto LAB_001114b6;
  case '\t':
    goto switchD_00110abe_caseD_9;
  default:
    goto LAB_001109c0;
  case '\r':
    uVar14 = ap->gp_offset;
    if ((ulong)uVar14 < 0x29) {
      puVar12 = (undefined8 *)((ulong)uVar14 + (long)ap->reg_save_area);
      ap->gp_offset = uVar14 + 8;
    }
    else {
      puVar12 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar12 + 1;
    }
    puVar12 = (undefined8 *)*puVar12;
    if ((puVar12 == (undefined8 *)0x0) || (__s = (char *)*puVar12, (byte *)__s == (byte *)0x0)) {
LAB_00111137:
      __s = " ";
      uVar14 = 1;
    }
    else {
      uVar14 = *(uint *)(puVar12 + 1);
    }
    goto LAB_001109c0;
  }
code_r0x0011098f:
  lVar22 = lVar22 + 0x20;
  if (lVar22 == 0x240) goto switchD_00110abe_caseD_9;
  goto LAB_00110982;
switchD_00110abe_caseD_9:
  abStack_439[1] = 0x3f;
  pbVar31 = pbVar31 + -(ulong)(iVar16 == 0);
LAB_001109ab:
  uVar14 = 1;
  __s = (char *)(abStack_439 + 1);
  goto LAB_001109c0;
  while (pbVar27 = pbVar23 + 4, pbVar23[2] != 0) {
LAB_00110e06:
    pbVar23 = pbVar27;
    if (pbVar23[-1] == 0) {
      pbVar23 = pbVar23 + -1;
      goto LAB_001115f4;
    }
    if (*pbVar23 == 0) goto LAB_001115f4;
    if (pbVar23[1] == 0) {
      pbVar23 = pbVar23 + 1;
      goto LAB_001115f4;
    }
  }
  pbVar23 = pbVar23 + 2;
LAB_001115f4:
  uVar30 = (int)pbVar23 - (int)__s;
LAB_001115f7:
  uVar14 = uVar30;
  if ((int)uVar26 < (int)uVar30) {
    uVar14 = uVar26;
  }
  if ((int)uVar26 < 0) {
    uVar14 = uVar30;
  }
  goto LAB_001109c0;
switchD_00110abe_caseD_2:
  uVar14 = ap->fp_offset;
  if ((ulong)uVar14 < 0xa1) {
    pdVar19 = (double *)((ulong)uVar14 + (long)ap->reg_save_area);
    ap->fp_offset = uVar14 + 0x10;
  }
  else {
    pdVar19 = (double *)ap->overflow_arg_area;
    ap->overflow_arg_area = pdVar19 + 1;
  }
  local_450 = *pdVar19;
  lVar35 = (longdouble)local_450;
  uVar14 = 0x3d8;
  if ((int)uVar26 < 0x3d8) {
    uVar14 = uVar26;
  }
  if ((int)uVar26 < 0) {
    uVar14 = 6;
  }
  if (0.0 <= local_450) {
    if (bVar33) {
      bVar29 = 0x2b;
      uVar32 = 1;
      bVar5 = false;
    }
    else {
      bVar5 = !bVar5;
      uVar32 = (ulong)!bVar5;
      bVar29 = !bVar5 << 5;
    }
  }
  else {
    lVar35 = -lVar35;
    bVar29 = 0x2d;
    uVar32 = 1;
    bVar5 = false;
  }
  uVar17 = (uint)(0 < (int)uVar14 && cVar1 == '\x04');
  uVar26 = uVar14 - uVar17;
  lVar36 = (longdouble)0.5;
  if (0 < (int)uVar26) {
    uVar14 = (uVar14 - uVar17) + 1;
    local_458 = 0.5;
    do {
      local_458 = local_458 * 0.1;
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
    lVar36 = (longdouble)local_458;
  }
  if (cVar1 == '\x02') {
    lVar35 = lVar35 + lVar36;
  }
  uVar13 = 0;
  if ((longdouble)0 < lVar35) {
    uVar14 = 0;
    if ((longdouble)1e+08 <= lVar35) {
      uVar17 = 0;
      do {
        lVar35 = lVar35 * (longdouble)1e-08;
        uVar14 = uVar17 + 8;
        if (lVar35 < (longdouble)1e+08) break;
        bVar33 = uVar17 < 0x157;
        uVar17 = uVar14;
      } while (bVar33);
    }
    uVar17 = uVar14;
    if (uVar14 < 0x15f && (longdouble)10.0 <= lVar35) {
      do {
        lVar35 = lVar35 * (longdouble)0.1;
        uVar14 = uVar17 + 1;
        if (lVar35 < (longdouble)10.0) break;
        bVar33 = uVar17 < 0x15e;
        uVar17 = uVar14;
      } while (bVar33);
    }
    uVar17 = uVar14;
    if (lVar35 < (longdouble)1e-08) {
      do {
        lVar35 = lVar35 * (longdouble)1e+08;
        uVar14 = uVar17 - 8;
        if ((longdouble)1e-08 <= lVar35) break;
        bVar33 = -0x157 < (int)uVar17;
        uVar17 = uVar14;
      } while (bVar33);
    }
    if ((longdouble)1 <= lVar35) {
      uVar13 = (ulong)uVar14;
    }
    else {
      uVar13 = (ulong)uVar14;
      if (-0x15f < (int)uVar14) {
        do {
          lVar35 = lVar35 * (longdouble)10.0;
          uVar13 = (ulong)(uVar14 - 1);
          if ((longdouble)1 <= lVar35) break;
          bVar33 = -0x15e < (int)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar33);
      }
    }
    uVar14 = 3;
    if ((int)uVar13 - 0x15fU < 0xfffffd43) {
      __s = "NaN";
      goto LAB_001109c0;
    }
  }
  if (cVar1 == '\x02') {
    bVar33 = true;
    bVar34 = false;
LAB_00110f78:
    if ((!bVar33) || (iVar16 = (int)uVar13, 0x3e1 < (int)(uVar26 + iVar16))) goto LAB_00111040;
    pbVar23 = abStack_439 + 1;
    if (!bVar5) {
      abStack_439[1] = bVar29;
      pbVar23 = abStack_439 + 2;
    }
    if (iVar16 < 0) {
      *pbVar23 = 0x30;
      pbVar23 = pbVar23 + 1;
      uVar17 = iVar16 + 1;
      uVar14 = 0;
    }
    else {
      lVar22 = 0;
      do {
        bVar29 = 0x30;
        if ((uint)lVar22 < 0x10) {
          lVar36 = ROUND(lVar35);
          lVar35 = (lVar35 - (longdouble)(int)lVar36) * (longdouble)10.0;
          bVar29 = (char)(int)lVar36 + 0x30;
        }
        pbVar23[lVar22] = bVar29;
        lVar22 = lVar22 + 1;
      } while (iVar16 + 1 != (int)lVar22);
      uVar14 = iVar16 + 1;
      pbVar23 = pbVar23 + lVar22;
      uVar17 = 0;
    }
    if ((int)uVar26 < 1 && !bVar7) {
LAB_001112ad:
      *pbVar23 = 0;
      pbVar23 = pbVar23 + -1;
    }
    else {
      pbVar27 = pbVar23 + 1;
      *pbVar23 = 0x2e;
      if ((0 < (int)uVar26) && ((int)uVar17 < 0)) {
        uVar10 = uVar26 - 1;
        uVar17 = ~uVar17;
        uVar4 = uVar17;
        if (uVar10 < uVar17) {
          uVar4 = uVar10;
        }
        local_468 = pbVar23 + (ulong)uVar4 + 2;
        uVar26 = uVar10 - uVar17;
        if (uVar10 < uVar17) {
          uVar26 = 0;
        }
        local_444 = lVar35;
        memset(pbVar27,0x30,(ulong)uVar4 + 1);
        pbVar27 = local_468;
        lVar35 = local_444;
      }
      if (0 < (int)uVar26) {
        uVar26 = uVar26 + 1;
        do {
          bVar29 = 0x30;
          if (uVar14 < 0x10) {
            lVar36 = ROUND(lVar35);
            lVar35 = (lVar35 - (longdouble)(int)lVar36) * (longdouble)10.0;
            bVar29 = (char)(int)lVar36 + 0x30;
          }
          *pbVar27 = bVar29;
          pbVar27 = pbVar27 + 1;
          uVar26 = uVar26 - 1;
          uVar14 = uVar14 + 1;
        } while (1 < uVar26);
      }
      *pbVar27 = 0;
      pbVar23 = pbVar27 + -1;
      if ((bool)(bVar34 & abStack_439 + 1 <= pbVar23)) {
        do {
          if (*pbVar23 != 0x30) {
            if (*pbVar23 == 0x2e) goto LAB_001112ad;
            break;
          }
          *pbVar23 = 0;
          pbVar23 = pbVar23 + -1;
        } while (abStack_439 + 1 <= pbVar23);
      }
    }
    iVar16 = (int)pbVar23 + 1;
  }
  else {
    lVar36 = lVar36 + lVar35;
    lVar35 = lVar36;
    if (lVar36 >= (longdouble)10.0) {
      lVar35 = lVar36 * (longdouble)0.1;
    }
    uVar14 = ((int)uVar13 + 1) - (uint)(lVar36 < (longdouble)10.0);
    uVar13 = (ulong)uVar14;
    if (cVar1 == '\x04') {
      bVar34 = !bVar7;
      bVar33 = (int)uVar14 <= (int)uVar26 && -5 < (int)uVar14;
      uVar17 = 0;
      if ((int)uVar14 <= (int)uVar26 && -5 < (int)uVar14) {
        uVar17 = uVar14;
      }
      uVar26 = uVar26 - uVar17;
      goto LAB_00110f78;
    }
    bVar34 = false;
LAB_00111040:
    pbVar23 = abStack_439 + 1;
    if (!bVar5) {
      abStack_439[1] = bVar29;
      pbVar23 = abStack_439 + 2;
    }
    lVar36 = (lVar35 - (longdouble)(int)ROUND(lVar35)) * (longdouble)10.0;
    *pbVar23 = (char)(int)ROUND(lVar35) + 0x30;
    if (0 < (int)uVar26 || bVar7) {
      pbVar27 = pbVar23 + 2;
      pbVar23[1] = 0x2e;
      if (0 < (int)uVar26) {
        uVar15 = 0;
        do {
          bVar29 = 0x30;
          if ((int)uVar15 + 1U < 0x10) {
            lVar35 = ROUND(lVar36);
            lVar36 = (lVar36 - (longdouble)(int)lVar35) * (longdouble)10.0;
            bVar29 = (char)(int)lVar35 + 0x30;
          }
          pbVar27[uVar15] = bVar29;
          uVar15 = uVar15 + 1;
        } while (uVar26 != uVar15);
        pbVar27 = pbVar27 + uVar15;
      }
      pbVar23 = pbVar27 + -1;
      if ((bool)(bVar34 & abStack_439 + 1 <= pbVar23)) {
        do {
          if (*pbVar23 != 0x30) {
            if (*pbVar23 == 0x2e) {
              *pbVar23 = 0;
              pbVar23 = pbVar23 + -1;
            }
            break;
          }
          *pbVar23 = 0;
          pbVar23 = pbVar23 + -1;
        } while (abStack_439 + 1 <= pbVar23);
      }
    }
    iVar16 = (int)uVar13;
    if ((cVar1 == '\x03') || (iVar16 != 0)) {
      pbVar23[1] = **(byte **)((long)&PTR_anon_var_dwarf_318b_00156290 + lVar22);
      uVar15 = (ulong)(uint)-iVar16;
      if (0 < iVar16) {
        uVar15 = uVar13;
      }
      pbVar23[2] = (char)(uVar13 >> 0x1f) * '\x02' + 0x2b;
      uVar14 = (uint)uVar15;
      if (uVar14 < 100) {
        pbVar23 = pbVar23 + 3;
      }
      else {
        pbVar23[3] = (char)(uVar15 / 100) + 0x30;
        pbVar23 = pbVar23 + 4;
        uVar14 = uVar14 + (int)(uVar15 / 100) * -100;
      }
      bVar29 = (byte)((uVar14 & 0xff) / 10);
      *pbVar23 = bVar29 | 0x30;
      pbVar23[1] = (char)uVar14 + bVar29 * -10 | 0x30;
      iVar16 = (int)pbVar23 + 2;
    }
    else {
      iVar16 = (int)pbVar23 + 1;
    }
  }
  uVar26 = iVar16 - ((int)abStack_439 + 1);
  uVar14 = uVar26;
  if (((bVar8) && (!bVar6)) && (uVar21 - uVar26 != 0 && (int)uVar26 <= (int)uVar21)) {
    if (-1 < (int)uVar26) {
      if (0x3f5 < (int)uVar30) {
        uVar30 = 0x3f6;
      }
      lVar22 = (long)(int)uVar30 + 1;
      do {
        abStack_439[lVar22] = abStack_439[lVar22 + ((long)(int)uVar26 - (long)(int)uVar21)];
        lVar22 = lVar22 + -1;
      } while ((int)(uVar21 - uVar26) < lVar22);
    }
    uVar14 = uVar21;
    if (uVar21 != uVar26) {
      memset(abStack_439 + uVar32 + 1,0x30,(ulong)(((int)local_460 + uVar21) - iVar16) + 1);
    }
  }
LAB_001114b6:
  __s = (char *)(abStack_439 + 1);
LAB_001109c0:
  uVar21 = uVar21 - uVar14;
  if ((!bVar6) && (0 < (int)uVar21)) {
    uVar30 = uVar21;
    if (0x31 < uVar21) {
      do {
        sVar9 = FormatConsumer(InternFormat_spaces,0x32,&local_490);
        if (sVar9 != 0) goto LAB_00111621;
        uVar30 = uVar30 - 0x32;
      } while (0x31 < uVar30);
      if (uVar30 == 0) goto LAB_00110a1f;
    }
    sVar9 = FormatConsumer(InternFormat_spaces,uVar30,&local_490);
    if (sVar9 != 0) goto LAB_00111621;
  }
LAB_00110a1f:
  if ((0 < (int)uVar14) && (sVar9 = FormatConsumer(__s,uVar14,&local_490), sVar9 != 0))
  goto LAB_00111621;
  if ((bVar6) && (0 < (int)uVar21)) {
    if (0x31 < uVar21) {
      do {
        sVar9 = FormatConsumer(InternFormat_spaces,0x32,&local_490);
        if (sVar9 != 0) goto LAB_00111621;
        uVar21 = uVar21 - 0x32;
      } while (0x31 < uVar21);
      if (uVar21 == 0) goto LAB_00110a8d;
    }
    sVar9 = FormatConsumer(InternFormat_spaces,uVar21,&local_490);
    if (sVar9 != 0) goto LAB_00111621;
  }
LAB_00110a8d:
  zFormat = (char *)(pbVar31 + 1);
  goto LAB_00110759;
}

Assistant:

static sxi32 FormatMount(sxi32 nType, void *pConsumer, ProcConsumer xUserCons, void *pUserData, sxu32 *pOutLen, const char *zFormat, va_list ap)
{
	SyFmtConsumer sCons;
	sCons.nType = nType;
	sCons.rc = SXRET_OK;
	sCons.nLen = 0;
	if( pOutLen ){
		*pOutLen = 0;
	}
	switch(nType){
	case SXFMT_CONS_PROC:
#if defined(UNTRUST)
			if( xUserCons == 0 ){
				return SXERR_EMPTY;
			}
#endif
			sCons.uConsumer.sFunc.xUserConsumer = xUserCons;
			sCons.uConsumer.sFunc.pUserData	    = pUserData;
		break;
		case SXFMT_CONS_BLOB:
			sCons.uConsumer.pBlob = (SyBlob *)pConsumer;
			break;
		default: 
			return SXERR_UNKNOWN;
	}
	InternFormat(FormatConsumer, &sCons, zFormat, ap); 
	if( pOutLen ){
		*pOutLen = sCons.nLen;
	}
	return sCons.rc;
}